

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::
OP_ProfileReturnTypeCallCommon<Js::OpLayoutDynamicProfile<Js::OpLayoutT_CallIFlags<Js::LayoutSizePolicy<(Js::LayoutSize)1>>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutDynamicProfile<Js::OpLayoutT_CallIFlags<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>_>
          *playout,RecyclableObject *function,uint flags,ProfileId profileId,
          AuxArray<unsigned_int> *spreadIndices)

{
  FunctionBody *this_00;
  DynamicProfileInfo *this_01;
  Var object;
  DynamicProfileInfo *dynamicProfileInfo;
  FunctionBody *functionBody;
  AuxArray<unsigned_int> *spreadIndices_local;
  ProfileId profileId_local;
  uint flags_local;
  RecyclableObject *function_local;
  OpLayoutDynamicProfile<Js::OpLayoutT_CallIFlags<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>_>
  *playout_local;
  InterpreterStackFrame *this_local;
  
  OP_CallCommon<Js::OpLayoutDynamicProfile<Js::OpLayoutT_CallIFlags<Js::LayoutSizePolicy<(Js::LayoutSize)1>>>__unaligned>
            (this,playout,function,flags,spreadIndices);
  this_00 = *(FunctionBody **)(this + 0x88);
  this_01 = FunctionBody::GetDynamicProfileInfo(this_00);
  if ((playout->super_OpLayoutT_CallIFlags<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>).
      super_OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>.Return != -1) {
    object = GetReg<unsigned_int>
                       (this,(int)(playout->
                                  super_OpLayoutT_CallIFlags<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>
                                  ).super_OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>.
                                  Return);
    DynamicProfileInfo::RecordReturnType(this_01,this_00,profileId,object);
  }
  return;
}

Assistant:

void InterpreterStackFrame::OP_ProfileReturnTypeCallCommon(const unaligned T * playout, RecyclableObject * function, unsigned flags, ProfileId profileId, const Js::AuxArray<uint32> *spreadIndices)
    {
        OP_CallCommon<T>(playout, function, flags, spreadIndices);
        FunctionBody* functionBody = this->m_functionBody;
        DynamicProfileInfo * dynamicProfileInfo = functionBody->GetDynamicProfileInfo();
        if (playout->Return != Js::Constants::NoRegister)
        {
            dynamicProfileInfo->RecordReturnType(functionBody, profileId, GetReg((RegSlot)playout->Return));
        }
    }